

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Typename.cpp
# Opt level: O2

void __thiscall enact::VariableTypename::VariableTypename(VariableTypename *this,Token *identifier)

{
  (this->super_Typename)._vptr_Typename = (_func_int **)&PTR__VariableTypename_001248d0;
  Token::Token(&this->m_identifier,identifier);
  std::operator+(&this->m_name,"$",&(this->m_identifier).lexeme);
  return;
}

Assistant:

VariableTypename::VariableTypename(Token identifier) :
            m_identifier{std::move(identifier)},
            m_name{"$" + m_identifier.lexeme} {
    }